

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

int32_t count_greater(uint16_t *array,int32_t lenarray,uint16_t ikey)

{
  uint uVar1;
  uint uVar2;
  
  if (lenarray != 0) {
    uVar1 = binarySearch(array,lenarray,ikey);
    uVar2 = uVar1 + 1;
    if (-1 < (int)uVar1) {
      uVar2 = ~uVar1;
    }
    return uVar2 + lenarray;
  }
  return 0;
}

Assistant:

static inline int32_t count_greater(const uint16_t *array, int32_t lenarray,
                                    uint16_t ikey) {
    if (lenarray == 0) return 0;
    int32_t pos = binarySearch(array, lenarray, ikey);
    if (pos >= 0) {
        return lenarray - (pos + 1);
    } else {
        return lenarray - (-pos - 1);
    }
}